

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3MsrIncrNext
              (Fts3Table *p,Fts3MultiSegReader *pMsr,sqlite3_int64 *piDocid,char **paPoslist,
              int *pnPoslist)

{
  char *pcVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  sqlite3_int64 iDocid;
  int j;
  int nList;
  char *pList;
  long lStack_58;
  int rc;
  Fts3SegReader *pSeg;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp;
  Fts3SegReader **apSegment;
  int *piStack_38;
  int nMerge;
  int *pnPoslist_local;
  char **paPoslist_local;
  sqlite3_int64 *piDocid_local;
  Fts3MultiSegReader *pMsr_local;
  Fts3Table *p_local;
  
  apSegment._4_4_ = pMsr->nAdvance;
  xCmp = (_func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *)pMsr->apSegment;
  pcVar3 = fts3SegReaderDoclistCmp;
  if (p->bDescIdx != '\0') {
    pcVar3 = fts3SegReaderDoclistCmpRev;
  }
  pSeg = (Fts3SegReader *)pcVar3;
  piStack_38 = pnPoslist;
  pnPoslist_local = (int *)paPoslist;
  paPoslist_local = (char **)piDocid;
  piDocid_local = (sqlite3_int64 *)pMsr;
  pMsr_local = (Fts3MultiSegReader *)p;
  if (apSegment._4_4_ == 0) {
    *paPoslist = (char *)0x0;
  }
  else {
    do {
      lStack_58 = *(long *)*piDocid_local;
      if (*(long *)(lStack_58 + 0x70) == 0) {
        pnPoslist_local[0] = 0;
        pnPoslist_local[1] = 0;
        return 0;
      }
      pcVar1 = *(char **)(*(long *)xCmp + 0x80);
      pList._4_4_ = fts3SegReaderNextDocid
                              ((Fts3Table *)pMsr_local,*(Fts3SegReader **)xCmp,(char **)&j,
                               (int *)((long)&iDocid + 4));
      iDocid._0_4_ = 1;
      while( true ) {
        bVar4 = false;
        if (((pList._4_4_ == 0) && (bVar4 = false, (int)iDocid < apSegment._4_4_)) &&
           (bVar4 = false, *(long *)(*(long *)(xCmp + (long)(int)iDocid * 8) + 0x70) != 0)) {
          bVar4 = *(char **)(*(long *)(xCmp + (long)(int)iDocid * 8) + 0x80) == pcVar1;
        }
        if (!bVar4) break;
        pList._4_4_ = fts3SegReaderNextDocid
                                ((Fts3Table *)pMsr_local,
                                 *(Fts3SegReader **)(xCmp + (long)(int)iDocid * 8),(char **)0x0,
                                 (int *)0x0);
        iDocid._0_4_ = (int)iDocid + 1;
      }
      if (pList._4_4_ != 0) {
        return pList._4_4_;
      }
      fts3SegReaderSort((Fts3SegReader **)*piDocid_local,apSegment._4_4_,(int)iDocid,
                        (_func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *)pSeg);
      if ((0 < iDocid._4_4_) && (*(long *)(*(long *)xCmp + 0x40) != 0)) {
        iVar2 = fts3MsrBufferData((Fts3MultiSegReader *)piDocid_local,_j,iDocid._4_4_ + 1);
        if (iVar2 != 0) {
          return iVar2;
        }
        _j = (char *)piDocid_local[3];
        pList._4_4_ = 0;
      }
      if (-1 < *(int *)((long)piDocid_local + 0x24)) {
        fts3ColumnFilter(*(int *)((long)piDocid_local + 0x24),1,(char **)&j,
                         (int *)((long)&iDocid + 4));
      }
    } while (iDocid._4_4_ < 1);
    *(char **)pnPoslist_local = _j;
    *paPoslist_local = pcVar1;
    *piStack_38 = iDocid._4_4_;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MsrIncrNext(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  sqlite3_int64 *piDocid,         /* OUT: Docid value */
  char **paPoslist,               /* OUT: Pointer to position list */
  int *pnPoslist                  /* OUT: Size of position list in bytes */
){
  int nMerge = pMsr->nAdvance;
  Fts3SegReader **apSegment = pMsr->apSegment;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( nMerge==0 ){
    *paPoslist = 0;
    return SQLITE_OK;
  }

  while( 1 ){
    Fts3SegReader *pSeg;
    pSeg = pMsr->apSegment[0];

    if( pSeg->pOffsetList==0 ){
      *paPoslist = 0;
      break;
    }else{
      int rc;
      char *pList;
      int nList;
      int j;
      sqlite3_int64 iDocid = apSegment[0]->iDocid;

      rc = fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
      j = 1;
      while( rc==SQLITE_OK 
        && j<nMerge
        && apSegment[j]->pOffsetList
        && apSegment[j]->iDocid==iDocid
      ){
        rc = fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
        j++;
      }
      if( rc!=SQLITE_OK ) return rc;
      fts3SegReaderSort(pMsr->apSegment, nMerge, j, xCmp);

      if( nList>0 && fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pMsr, pList, nList+1);
        if( rc!=SQLITE_OK ) return rc;
        assert( (pMsr->aBuffer[nList] & 0xFE)==0x00 );
        pList = pMsr->aBuffer;
      }

      if( pMsr->iColFilter>=0 ){
        fts3ColumnFilter(pMsr->iColFilter, 1, &pList, &nList);
      }

      if( nList>0 ){
        *paPoslist = pList;
        *piDocid = iDocid;
        *pnPoslist = nList;
        break;
      }
    }
  }

  return SQLITE_OK;
}